

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::tryCatchStatement(Parser *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  undefined1 local_b0 [24];
  ptr<StatementBlock> catchBlock;
  string local_88 [48];
  undefined1 local_58 [8];
  Identifier identifier;
  undefined1 local_28 [8];
  ptr<StatementBlock> tryBlock;
  Parser *this_local;
  
  consume(in_RSI);
  statementBlock((Parser *)local_28);
  consume(in_RSI,Catch,"\'catch\'");
  std::__cxx11::string::string((string *)local_58);
  bVar1 = match(in_RSI,Identifier);
  if (bVar1) {
    token((Token *)&catchBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,in_RSI);
    std::__cxx11::string::operator=((string *)local_58,local_88);
    Token::~Token((Token *)&catchBlock.
                            super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    consume(in_RSI);
  }
  statementBlock((Parser *)(local_b0 + 0x10));
  make<TryCatchStatement,std::__cxx11::string&,std::shared_ptr<StatementBlock>&,std::shared_ptr<StatementBlock>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
             (shared_ptr<StatementBlock> *)local_58,(shared_ptr<StatementBlock> *)local_28);
  std::shared_ptr<Statement>::shared_ptr<TryCatchStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<TryCatchStatement> *)local_b0);
  std::shared_ptr<TryCatchStatement>::~shared_ptr((shared_ptr<TryCatchStatement> *)local_b0);
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)(local_b0 + 0x10));
  std::__cxx11::string::~string((string *)local_58);
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)local_28);
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::tryCatchStatement() {
    consume();

    ptr<StatementBlock> tryBlock = statementBlock();
    consume(TokenType::Catch, "'catch'");

    Identifier identifier;
    if(match(TokenType::Identifier)) {
        identifier = token().lexeme;
        consume();
    }

    ptr<StatementBlock> catchBlock = statementBlock();

    return make<TryCatchStatement>(identifier, tryBlock, catchBlock);
}